

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdantzigpr.hpp
# Opt level: O2

SPxId __thiscall
soplex::
SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterSparseDim
          (SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,SPxId *enterId)

{
  uint *puVar1;
  int i;
  int iVar2;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar3;
  pointer pnVar4;
  undefined8 uVar5;
  int *piVar6;
  type_conflict5 tVar7;
  DataKey DVar8;
  ulong uVar9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  for (uVar9 = (ulong)(uint)(((this->
                              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).thesolver)->infeasibilities).super_IdxSet.num; 0 < (int)uVar9;
      uVar9 = uVar9 - 1) {
    pSVar3 = (this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    pnVar4 = (pSVar3->theCoTest).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    i = (pSVar3->infeasibilities).super_IdxSet.idx[uVar9 - 1];
    uVar5 = *(undefined8 *)((long)&pnVar4[i].m_backend.data + 0x20);
    local_a8.m_backend.data._M_elems._32_5_ = SUB85(uVar5,0);
    local_a8.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
    local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar4[i].m_backend.data;
    local_a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar4[i].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar4[i].m_backend.data + 0x10);
    local_a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    uVar5 = *(undefined8 *)(puVar1 + 2);
    local_a8.m_backend.data._M_elems._24_5_ = SUB85(uVar5,0);
    local_a8.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
    local_a8.m_backend.exp = pnVar4[i].m_backend.exp;
    local_a8.m_backend.neg = pnVar4[i].m_backend.neg;
    local_a8.m_backend.fpclass = pnVar4[i].m_backend.fpclass;
    local_a8.m_backend.prec_elem = pnVar4[i].m_backend.prec_elem;
    local_68.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)
          ((this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thetolerance.m_backend.data._M_elems + 8);
    local_68.m_backend.data._M_elems._0_8_ =
         *(undefined8 *)
          (this->
          super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thetolerance.m_backend.data._M_elems;
    local_68.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)
          ((this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thetolerance.m_backend.data._M_elems + 2);
    local_68.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)
          ((this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thetolerance.m_backend.data._M_elems + 4);
    local_68.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)
          ((this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thetolerance.m_backend.data._M_elems + 6);
    local_68.m_backend.exp =
         (this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.exp;
    local_68.m_backend.neg =
         (this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.neg;
    local_68.m_backend.fpclass =
         (this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.fpclass;
    local_68.m_backend.prec_elem =
         (this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.prec_elem;
    if (local_68.m_backend.fpclass != cpp_dec_float_finite ||
        local_68.m_backend.data._M_elems[0] != 0) {
      local_68.m_backend.neg = (bool)(local_68.m_backend.neg ^ 1);
    }
    tVar7 = boost::multiprecision::operator<(&local_a8,&local_68);
    if (tVar7) {
      tVar7 = boost::multiprecision::operator<(&local_a8,best);
      if (tVar7) {
        DVar8 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ::coId((this->
                                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).thesolver,i);
        enterId->super_DataKey = DVar8;
        *(undefined8 *)(best->m_backend).data._M_elems = local_a8.m_backend.data._M_elems._0_8_;
        *(undefined8 *)((best->m_backend).data._M_elems + 2) =
             local_a8.m_backend.data._M_elems._8_8_;
        *(undefined8 *)((best->m_backend).data._M_elems + 4) =
             local_a8.m_backend.data._M_elems._16_8_;
        *(ulong *)((best->m_backend).data._M_elems + 6) =
             CONCAT35(local_a8.m_backend.data._M_elems[7]._1_3_,
                      local_a8.m_backend.data._M_elems._24_5_);
        *(ulong *)((best->m_backend).data._M_elems + 8) =
             CONCAT35(local_a8.m_backend.data._M_elems[9]._1_3_,
                      local_a8.m_backend.data._M_elems._32_5_);
        (best->m_backend).exp = local_a8.m_backend.exp;
        (best->m_backend).neg = local_a8.m_backend.neg;
        (best->m_backend).fpclass = local_a8.m_backend.fpclass;
        (best->m_backend).prec_elem = local_a8.m_backend.prec_elem;
      }
    }
    else {
      pSVar3 = (this->
               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver;
      piVar6 = (pSVar3->infeasibilities).super_IdxSet.idx;
      iVar2 = (pSVar3->infeasibilities).super_IdxSet.num;
      (pSVar3->infeasibilities).super_IdxSet.num = iVar2 + -1;
      piVar6[uVar9 - 1] = piVar6[(long)iVar2 + -1];
      (pSVar3->isInfeasible).data[i] = 0;
    }
  }
  return (SPxId)enterId->super_DataKey;
}

Assistant:

SPxId SPxDantzigPR<R>::selectEnterSparseDim(R& best, SPxId& enterId)
{
   assert(this->thesolver != nullptr);

   int idx;
   R x;

   for(int i = this->thesolver->infeasibilities.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilities.index(i);
      x = this->thesolver->coTest()[idx];

      if(x < -this->thetolerance)
      {
         if(x < best)
         {
            enterId = this->thesolver->coId(idx);
            best = x;
         }
      }
      else
      {
         this->thesolver->infeasibilities.remove(i);

         assert(this->thesolver->isInfeasible[idx]);
         this->thesolver->isInfeasible[idx] = 0;
      }
   }

   return enterId;
}